

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O3

void dijkstra_sync(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   *adj_list,int from,vector<int,_std::allocator<int>_> *dists)

{
  pointer piVar1;
  pointer pvVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int v;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Timer timer;
  Timer local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  uVar8 = (int)((long)(adj_list->
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(adj_list->
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,999999);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (dists,(long)(int)uVar8,(value_type_conflict *)&local_58);
  (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [from] = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&local_58,(long)(int)uVar8,false);
  Timer::Timer(&local_60);
  if (0 < (int)uVar8) {
    piVar1 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pvVar2 = (adj_list->
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      piVar3 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = -1;
      uVar9 = 0;
      do {
        if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6 & 0x3ffffff] >> (uVar9 & 0x3f) & 1)
             == 0) && ((iVar7 == -1 || (piVar3[uVar9] < piVar3[iVar7])))) {
          iVar7 = (int)uVar9;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar9);
      uVar9 = (ulong)iVar7;
      if (piVar1[uVar9] == 999999) goto LAB_00102672;
      iVar5 = iVar7 + 0x3f;
      if (-1 < iVar7) {
        iVar5 = iVar7;
      }
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [(long)(iVar5 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar5 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)iVar7 & 0x3f);
      lVar4 = *(long *)&pvVar2[uVar9].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar10 = (long)*(pointer *)
                      ((long)&pvVar2[uVar9].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data + 8) - lVar4;
      if (lVar10 != 0) {
        lVar10 = lVar10 >> 3;
        lVar11 = 0;
        do {
          iVar7 = *(int *)(lVar4 + lVar11 * 8);
          iVar5 = piVar1[uVar9] + *(int *)(lVar4 + 4 + lVar11 * 8);
          if (iVar5 < piVar1[iVar7]) {
            piVar1[iVar7] = iVar5;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar8);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
LAB_00102672:
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void dijkstra_sync(const vector<vector<pair<int, int>>>& adj_list, int from, vector<int>& dists){
    int vs = adj_list.size();
    dists.assign(vs, MAX_INT);
    dists[from] = 0;
    vector<bool> used;
    used.assign(vs, false);
    int curr_v;

    Timer timer = Timer();

    for (int i=0; i<vs; i++){
        // search unused
        curr_v = -1;

        for (int v=0; v<vs; v++) {
            if (!used[v] && (curr_v == -1 || dists[v] < dists[curr_v])) {
                curr_v = v;
            }
        }
        // have visited all reachable vertexes
        if (dists[curr_v] == MAX_INT){
            return;
        }

        used[curr_v] = true;

        int to, weight;
        // Search least path
        for (int j=0; j<adj_list[curr_v].size(); j++){
            to = adj_list[curr_v][j].first;
            weight = adj_list[curr_v][j].second;
            if (dists[curr_v] + weight < dists[to]){
                // Relax
                dists[to] = dists[curr_v] + weight;
            }
        }
    }
}